

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execAdda<(moira::Instr)119,(moira::Mode)6,(moira::Size)2>(Moira *this,u16 opcode)

{
  int iVar1;
  u32 uVar2;
  u32 uVar3;
  undefined8 in_RAX;
  ulong uVar4;
  bool error;
  bool local_21;
  
  local_21 = SUB81((ulong)in_RAX >> 0x38,0);
  uVar2 = computeEA<(moira::Mode)6,(moira::Size)2,0ul>(this,opcode & 7);
  uVar2 = readM<(moira::MemSpace)1,(moira::Size)2,128ul>(this,uVar2,&local_21);
  if (local_21 == false) {
    uVar4 = (ulong)(opcode >> 9 & 7);
    iVar1 = *(int *)((long)this->exec + uVar4 * 4 + -0x38);
    uVar3 = (this->reg).pc;
    (this->reg).pc0 = uVar3;
    (this->queue).ird = (this->queue).irc;
    uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar3 + 2);
    (this->queue).irc = (u16)uVar3;
    (*this->_vptr_Moira[0x19])(this,2);
    (*this->_vptr_Moira[0x19])(this,2);
    *(int *)((long)this->exec + uVar4 * 4 + -0x38) = iVar1 - (short)uVar2;
  }
  return;
}

Assistant:

void
Moira::execAdda(u16 opcode)
{
    u32 ea, data, result;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;
    data = SEXT<S>(data);

    result = (I == ADDA) ? readA(dst) + data : readA(dst) - data;
    prefetch<POLLIPL>();

    sync(2);
    if (S == Word || isRegMode(M) || isImmMode(M)) sync(2);
    writeA(dst, result);
}